

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCOError __thiscall RCO::getStyleId(RCO *this,string *s,uint32_t offset)

{
  char local_128 [8];
  char buf [256];
  uint32_t styleid;
  uint32_t offset_local;
  string *s_local;
  RCO *this_local;
  
  snprintf(local_128,0x100,"%x",
           (ulong)*(uint *)(this->mBuffer + (ulong)offset * 4 + (ulong)(this->mHeader).styles_off));
  std::__cxx11::string::operator=((string *)s,local_128);
  return NO_ERROR;
}

Assistant:

RCOError RCO::getStyleId(std::string& s, uint32_t offset)
{
	uint32_t styleid;

	memcpy(&styleid, mBuffer + mHeader.styles_off + offset * sizeof(uint32_t), sizeof(uint32_t));

	char buf[256];
	snprintf(buf, 256, "%x", styleid);

	s = buf;

	return NO_ERROR;
}